

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++:409:34)>
::getImpl(SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:409:34)>
          *this,ExceptionOrValue *output)

{
  size_t extraout_RDX;
  ArrayPtr<void_*const> AVar1;
  ArrayPtr<void_*> space;
  ExceptionOr<kj::_::Void> depResult;
  void *scratch [16];
  bool local_3f9;
  ExceptionOr<kj::_::Void> local_3f8;
  ExceptionOrValue local_258;
  char local_c0;
  kj local_b8 [136];
  
  local_258.exception.ptr.isSet = false;
  local_c0 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_258);
  if (local_258.exception.ptr.isSet == true) {
    local_3f8.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_258.exception.ptr.field_1.value.ownFile.content.ptr;
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_258.exception.ptr.field_1.value.ownFile.content.size_;
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_258.exception.ptr.field_1.value.ownFile.content.disposer;
    local_258.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_258.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_258.exception.ptr.field_1.value.file;
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_258.exception.ptr.field_1._32_8_;
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_258.exception.ptr.field_1.value.description.content.ptr;
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_258.exception.ptr.field_1.value.description.content.size_;
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_258.exception.ptr.field_1.value.description.content.disposer;
    local_258.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_258.exception.ptr.field_1.value.description.content.size_ = 0;
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_258.exception.ptr.field_1.value.context.ptr.disposer;
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         local_258.exception.ptr.field_1.value.context.ptr.ptr;
    local_258.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_258.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_258.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_258.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_258.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_258.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_3f8.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_258.exception.ptr.field_1 + 0x68),0x105);
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_258.exception.ptr.field_1.value.details.builder.ptr;
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_258.exception.ptr.field_1.value.details.builder.pos;
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_258.exception.ptr.field_1.value.details.builder.endPtr;
    local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_258.exception.ptr.field_1.value.details.builder.disposer;
    local_258.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_258.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_258.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_3f8.value.ptr.isSet = false;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_3f8);
  }
  else {
    if (local_c0 != '\x01') goto LAB_001d307a;
    space.size_ = extraout_RDX;
    space.ptr = (void **)&DAT_00000010;
    AVar1 = getAsyncTrace(local_b8,space);
    local_3f9 = AVar1.size_ - 1 < 3;
    if ((!local_3f9) && (Debug::minSeverity < 3)) {
      Debug::log<char_const(&)[41],bool&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
                 ,0x1a0,ERROR,"\"failed: expected \" \"0 < count && count <= 3\", _kjCondition",
                 (char (*) [41])"failed: expected 0 < count && count <= 3",&local_3f9);
    }
    local_3f8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_3f8.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_3f8);
  }
  if (local_3f8.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_3f8.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_001d307a:
  if (local_258.exception.ptr.isSet == true) {
    Exception::~Exception(&local_258.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }